

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferRenderInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,TexelBufferRenderInstance *this,
          ConstPixelBufferAccess *result)

{
  int iVar1;
  bool bVar2;
  uint width;
  uint height;
  TestContext *this_00;
  TestLog *log;
  UVec2 *this_01;
  allocator<char> local_151;
  string local_150;
  undefined4 local_130;
  allocator<char> local_129;
  string local_128;
  RGBA local_104;
  ConstPixelBufferAccess local_100;
  PixelBufferAccess local_c8;
  undefined1 local_a0 [8];
  Surface reference;
  Vec4 sample3;
  Vec4 sample2;
  Vec4 sample1;
  Vec4 sample0;
  bool doFetch;
  Vec4 yellow;
  Vec4 green;
  ConstPixelBufferAccess *result_local;
  TexelBufferRenderInstance *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(sample0.m_data + 3),1.0,1.0,0.0,1.0);
  sample0.m_data[2]._3_1_ = this->m_stageFlags != 0;
  iVar1 = (int)this;
  if ((bool)sample0.m_data[2]._3_1_) {
    TexelBufferInstanceBuffers::fetchTexelValue
              ((TexelBufferInstanceBuffers *)(sample1.m_data + 2),iVar1 + 0x1f0);
  }
  else {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(sample1.m_data + 2),(Vector<float,_4> *)(sample0.m_data + 3));
  }
  if ((sample0.m_data[2]._3_1_ & 1) == 0) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(sample2.m_data + 2),(Vector<float,_4> *)(yellow.m_data + 2));
  }
  else {
    TexelBufferInstanceBuffers::fetchTexelValue
              ((TexelBufferInstanceBuffers *)(sample2.m_data + 2),iVar1 + 0x1f0);
  }
  if ((sample0.m_data[2]._3_1_ & 1) == 0) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(sample3.m_data + 2),(Vector<float,_4> *)(yellow.m_data + 2));
  }
  else {
    TexelBufferInstanceBuffers::fetchTexelValue
              ((TexelBufferInstanceBuffers *)(sample3.m_data + 2),iVar1 + 0x1f0);
  }
  if ((sample0.m_data[2]._3_1_ & 1) == 0) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)((long)&reference.m_pixels.m_cap + 4),
               (Vector<float,_4> *)(sample0.m_data + 3));
  }
  else {
    TexelBufferInstanceBuffers::fetchTexelValue
              ((TexelBufferInstanceBuffers *)((long)&reference.m_pixels.m_cap + 4),iVar1 + 0x1f0);
  }
  this_01 = &(this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize;
  width = tcu::Vector<unsigned_int,_2>::x(this_01);
  height = tcu::Vector<unsigned_int,_2>::y(this_01);
  tcu::Surface::Surface((Surface *)local_a0,width,height);
  tcu::Surface::getAccess(&local_c8,(Surface *)local_a0);
  drawQuadrantReferenceResult
            (&local_c8,(Vec4 *)(sample1.m_data + 2),(Vec4 *)(sample2.m_data + 2),
             (Vec4 *)(sample3.m_data + 2),(Vec4 *)((long)&reference.m_pixels.m_cap + 4));
  this_00 = Context::getTestContext
                      ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.
                       super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_00);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_100,(Surface *)local_a0);
  tcu::RGBA::RGBA(&local_104,1,1,1,1);
  bVar2 = tcu::bilinearCompare
                    (log,"Compare","Result comparison",&local_100,result,local_104,
                     COMPARE_LOG_RESULT);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Pass",&local_151);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"Image verification failed",&local_129);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  local_130 = 1;
  tcu::Surface::~Surface((Surface *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TexelBufferRenderInstance::verifyResultImage (const tcu::ConstPixelBufferAccess& result) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow		(1.0f, 1.0f, 0.0f, 1.0f);
	const bool			doFetch		= (m_stageFlags != 0u); // no active stages? Then don't fetch
	const tcu::Vec4		sample0		= (!doFetch) ? (yellow)	: (m_texelBuffers.fetchTexelValue(0));
	const tcu::Vec4		sample1		= (!doFetch) ? (green)	: (m_texelBuffers.fetchTexelValue(1));
	const tcu::Vec4		sample2		= (!doFetch) ? (green)	: (m_texelBuffers.fetchTexelValue(2));
	const tcu::Vec4		sample3		= (!doFetch) ? (yellow)	: (m_texelBuffers.fetchTexelValue(3));
	tcu::Surface		reference	(m_targetSize.x(), m_targetSize.y());

	drawQuadrantReferenceResult(reference.getAccess(), sample0, sample1, sample2, sample3);

	if (!bilinearCompare(m_context.getTestContext().getLog(), "Compare", "Result comparison", reference.getAccess(), result, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_RESULT))
		return tcu::TestStatus::fail("Image verification failed");
	else
		return tcu::TestStatus::pass("Pass");
}